

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
Validator_validMathCnElementsMissingCellMLNamespace_Test::
~Validator_validMathCnElementsMissingCellMLNamespace_Test
          (Validator_validMathCnElementsMissingCellMLNamespace_Test *this)

{
  Validator_validMathCnElementsMissingCellMLNamespace_Test *this_local;
  
  ~Validator_validMathCnElementsMissingCellMLNamespace_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, validMathCnElementsMissingCellMLNamespace)
{
    const std::string math =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "  <apply>\n"
        "    <eq/>\n"
        "    <ci>C</ci>\n"
        "    <apply>\n"
        "      <plus/>\n"
        "      <cn cellml:units=\"dimensionless\" type=\"e-notation\">3.44<sep/>2</cn>\n"
        "      <cn cellml:units=\"dimensionless\">-9.612</cn>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</math>\n";

    const std::vector<std::string> expectedIssues {
        "LibXml2 error: Namespace prefix cellml for units on cn is not defined.",
        "LibXml2 error: Namespace prefix cellml for units on cn is not defined.",
        "Math cn element with the value '3.44' does not have a valid cellml:units attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Math cn element with the value '-9.612' does not have a valid cellml:units attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "W3C MathML DTD error: Namespace prefix cellml for units on cn is not defined.",
        "W3C MathML DTD error: Namespace prefix cellml for units on cn is not defined.",
        "W3C MathML DTD error: No declaration for attribute cellml:units of element cn.",
        "W3C MathML DTD error: No declaration for attribute cellml:units of element cn.",
    };

    libcellml::ValidatorPtr v = libcellml::Validator::create();
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();

    m->setName("modelName");
    c->setName("componentName");
    v1->setName("C");
    v1->setInitialValue("3.5");
    v1->setUnits("dimensionless");

    c->addVariable(v1);
    c->setMath(math);
    m->addComponent(c);

    v->validateModel(m);
    EXPECT_EQ_ISSUES(expectedIssues, v);
}